

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Reader value;
  WirePointer *this;
  char *pcVar1;
  CapTableBuilder *in_RCX;
  SegmentBuilder *in_RDX;
  BuilderArena *in_R8;
  size_t in_stack_ffffffffffffff60;
  undefined1 local_58 [8];
  SegmentAnd<capnp::Text::Builder> allocation;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  Reader copyFrom_local;
  OrphanBuilder *result;
  
  allocation.value.content.size_._7_1_ = 0;
  OrphanBuilder((OrphanBuilder *)dst);
  this = tagAsPtr((OrphanBuilder *)dst);
  value.super_StringPtr.content.size_ = in_stack_ffffffffffffff60;
  value.super_StringPtr.content.ptr = (char *)src;
  WireHelpers::setTextPointer
            ((SegmentAnd<capnp::Text::Builder> *)local_58,(WireHelpers *)this,(WirePointer *)0x0,
             in_RDX,in_RCX,value,in_R8);
  *(undefined1 (*) [8])(dst + 8) = local_58;
  *(SegmentBuilder **)(dst + 0x10) = in_RDX;
  pcVar1 = Text::Builder::begin((Builder *)&allocation);
  *(char **)(dst + 0x18) = pcVar1;
  return (int)dst;
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Text::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setTextPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}